

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O3

void squall::detail::defun<1,void,Foo2*>
               (HSQUIRRELVM vm,string *name,function<void_(Foo2_*)> *f,string *argtypemask)

{
  sq_pushstring(vm,(name->_M_dataplus)._M_p,name->_M_string_length);
  construct_object<std::function<void(Foo2*)>>(vm,f);
  sq_newclosure(vm,stub<1,std::function<void(Foo2*)>>,1);
  sq_setparamscheck(vm,-99999,(argtypemask->_M_dataplus)._M_p);
  sq_setnativeclosurename(vm,-1,(name->_M_dataplus)._M_p);
  sq_newslot(vm,-3,0);
  return;
}

Assistant:

void defun(
    HSQUIRRELVM vm,
    const string& name,
    const std::function<R (T...)>& f,
    const string& argtypemask) {

    sq_pushstring(vm, name.data(), name.length());
    construct_object(vm, f);
    sq_newclosure(vm, stub<Offset, std::function<R (T...)>>, 1);
    sq_setparamscheck(vm, SQ_MATCHTYPEMASKSTRING, argtypemask.c_str());
    sq_setnativeclosurename(vm, -1, name.c_str());
    sq_newslot(vm, -3, SQFalse);
}